

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

void duckdb::ListRangeFunction<duckdb::NumericRangeInfo,true>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  bool bVar2;
  reference pvVar3;
  uint64_t uVar4;
  long lVar5;
  TYPE TVar6;
  INCREMENT_TYPE IVar7;
  ulong uVar8;
  long lVar9;
  idx_t i_1;
  idx_t iVar10;
  long lVar11;
  uint64_t *puVar12;
  idx_t i_2;
  idx_t i;
  ulong uVar13;
  idx_t local_130;
  RangeInfoStruct<duckdb::NumericRangeInfo,_true> info;
  
  RangeInfoStruct<duckdb::NumericRangeInfo,_true>::RangeInfoStruct(&info,args);
  uVar13 = 0;
  local_130 = 1;
  do {
    if ((ulong)((*(long *)(args + 8) - *(long *)args) / 0x68) <= uVar13) goto LAB_0071652c;
    pvVar3 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar13);
    uVar13 = uVar13 + 1;
  } while (*pvVar3 == (value_type)0x2);
  local_130 = *(idx_t *)(args + 0x18);
LAB_0071652c:
  lVar1 = *(long *)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  puVar12 = (uint64_t *)(lVar1 + 8);
  uVar13 = 0;
  for (iVar10 = 0; local_130 != iVar10; iVar10 = iVar10 + 1) {
    bVar2 = RangeInfoStruct<duckdb::NumericRangeInfo,_true>::RowIsValid(&info,iVar10);
    if (bVar2) {
      puVar12[-1] = uVar13;
      uVar4 = RangeInfoStruct<duckdb::NumericRangeInfo,_true>::ListLength(&info,iVar10);
      *puVar12 = uVar4;
      uVar13 = uVar13 + uVar4;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),iVar10);
      puVar12[-1] = uVar13;
      *puVar12 = 0;
    }
    puVar12 = puVar12 + 2;
  }
  duckdb::ListVector::Reserve(result,uVar13);
  lVar5 = duckdb::ListVector::GetEntry(result);
  lVar5 = *(long *)(lVar5 + 0x20);
  lVar9 = 0;
  for (iVar10 = 0; iVar10 != local_130; iVar10 = iVar10 + 1) {
    TVar6 = RangeInfoStruct<duckdb::NumericRangeInfo,_true>::StartListValue(&info,iVar10);
    IVar7 = RangeInfoStruct<duckdb::NumericRangeInfo,_true>::ListIncrementValue(&info,iVar10);
    for (uVar8 = 0; uVar8 < *(ulong *)(lVar1 + iVar10 * 0x10 + 8); uVar8 = uVar8 + 1) {
      lVar11 = IVar7;
      if (uVar8 == 0) {
        lVar11 = 0;
      }
      TVar6 = TVar6 + lVar11;
      *(TYPE *)(lVar5 + lVar9 * 8 + uVar8 * 8) = TVar6;
    }
    lVar9 = lVar9 + uVar8;
  }
  duckdb::ListVector::SetListSize(result,uVar13);
  duckdb::Vector::SetVectorType((VectorType)result);
  duckdb::Vector::Verify((ulong)result);
  RangeInfoStruct<duckdb::NumericRangeInfo,_true>::~RangeInfoStruct(&info);
  return;
}

Assistant:

static void ListRangeFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);

	RangeInfoStruct<OP, INCLUSIVE_BOUND> info(args);
	idx_t args_size = 1;
	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			args_size = args.size();
			result_type = VectorType::FLAT_VECTOR;
			break;
		}
	}
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_validity = FlatVector::Validity(result);
	uint64_t total_size = 0;
	for (idx_t i = 0; i < args_size; i++) {
		if (!info.RowIsValid(i)) {
			result_validity.SetInvalid(i);
			list_data[i].offset = total_size;
			list_data[i].length = 0;
		} else {
			list_data[i].offset = total_size;
			list_data[i].length = info.ListLength(i);
			total_size += list_data[i].length;
		}
	}

	// now construct the child vector of the list
	ListVector::Reserve(result, total_size);
	auto range_data = FlatVector::GetData<typename OP::TYPE>(ListVector::GetEntry(result));
	idx_t total_idx = 0;
	for (idx_t i = 0; i < args_size; i++) {
		typename OP::TYPE start_value = info.StartListValue(i);
		typename OP::INCREMENT_TYPE increment = info.ListIncrementValue(i);

		typename OP::TYPE range_value = start_value;
		for (idx_t range_idx = 0; range_idx < list_data[i].length; range_idx++) {
			if (range_idx > 0) {
				OP::Increment(range_value, increment);
			}
			range_data[total_idx++] = range_value;
		}
	}

	ListVector::SetListSize(result, total_size);
	result.SetVectorType(result_type);

	result.Verify(args.size());
}